

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O3

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,sc_unsigned *a)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  word *pwVar4;
  ulong uVar5;
  sc_unsigned_bitref_r *this_00;
  uint64 uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar12;
  int iVar11;
  
  (this->m_mant).m_array = (word *)0x0;
  (this->m_mant).m_size = 4;
  pwVar4 = scfx_mant::alloc_word(4);
  (this->m_mant).m_array = pwVar4;
  this->m_wp = 0;
  this->m_sign = 0;
  this->m_state = normal;
  this->m_msw = 0;
  *(undefined8 *)((long)&this->m_msw + 1) = 0;
  bVar3 = sc_unsigned::iszero(a);
  if (bVar3) {
    if (0 < (this->m_mant).m_size) {
      pwVar4 = (this->m_mant).m_array;
      lVar7 = 0;
      do {
        pwVar4[lVar7] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (this->m_mant).m_size);
    }
    this->m_lsw = 0;
    this->m_wp = 0;
    this->m_sign = 1;
    this->m_state = normal;
    this->m_msw = 0;
  }
  else {
    iVar2 = a->nbits + 0x1e;
    iVar11 = a->nbits + 0x3d;
    if (-1 < iVar2) {
      iVar11 = iVar2;
    }
    uVar10 = iVar11 >> 5;
    uVar9 = (this->m_mant).m_size;
    uVar5 = (ulong)uVar9;
    if ((int)uVar9 < (int)uVar10) {
      if ((this->m_mant).m_array == (word *)0x0) {
        (this->m_mant).m_size = uVar10;
        pwVar4 = scfx_mant::alloc_word((long)(int)uVar10);
        (this->m_mant).m_array = pwVar4;
        uVar5 = (ulong)(uint)(this->m_mant).m_size;
      }
      else {
        pwVar4 = scfx_mant::alloc_word((long)(int)uVar10);
        scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
        (this->m_mant).m_array = pwVar4;
        (this->m_mant).m_size = uVar10;
        uVar5 = (ulong)uVar10;
      }
    }
    if (0 < (int)uVar5) {
      pwVar4 = (this->m_mant).m_array;
      lVar7 = 0;
      do {
        pwVar4[lVar7] = 0;
        lVar7 = lVar7 + 1;
        uVar5 = (ulong)(this->m_mant).m_size;
      } while (lVar7 < (long)uVar5);
    }
    uVar12 = 0;
    this->m_wp = 0;
    this->m_state = normal;
    if (1 < a->nbits) {
      uVar9 = 0;
      do {
        this_00 = sc_unsigned::operator[](a,uVar9);
        uVar6 = sc_unsigned_bitref_r::operator_cast_to_unsigned_long_long(this_00);
        if (uVar6 != 0) {
          puVar1 = (this->m_mant).m_array + (int)((uVar9 >> 5) + this->m_wp);
          *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < a->nbits + -1);
      uVar5 = (ulong)(uint)(this->m_mant).m_size;
    }
    this->m_sign = 1;
    pwVar4 = (this->m_mant).m_array;
    uVar8 = uVar5 & 0xffffffff;
    if (0 < (int)uVar5) {
      uVar12 = 0;
      do {
        if (pwVar4[uVar12] != 0) goto LAB_001c0683;
        uVar12 = uVar12 + 1;
      } while (uVar8 != uVar12);
      uVar12 = 0;
    }
LAB_001c0683:
    this->m_lsw = (int)uVar12;
    do {
      uVar8 = uVar8 - 1;
      if ((int)uVar5 < 1) {
        uVar9 = 0;
        break;
      }
      uVar9 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar9;
    } while (pwVar4[uVar8 & 0xffffffff] == 0);
    this->m_msw = uVar9;
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( const sc_unsigned& a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a.iszero() )
	set_zero();
    else
    {
	int words = n_word( a.length() );
	if( words > size() )
	    resize_to( words );
	m_mant.clear();
	m_wp = 0;
	m_state = normal;
	for( int i = 0; i < a.length(); ++ i )
	{
	    if( a[i] )
	    {
		scfx_index x = calc_indices( i );
		m_mant[x.wi()] |= 1 << x.bi();
	    }
	}
	m_sign = 1;
	find_sw();
    }
}